

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O1

int Sfm_TimTrace(Sfm_Tim_t *p)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  int *piVar5;
  Vec_Ptr_t *pVVar6;
  long *plVar7;
  void **ppvVar8;
  bool bVar9;
  ulong uVar10;
  Vec_Ptr_t *__ptr;
  int *piVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  size_t __size;
  long lVar15;
  long lVar16;
  int iVar17;
  
  __ptr = Abc_NtkDfs(p->pNtk,1);
  if (0 < __ptr->nSize) {
    lVar16 = 0;
    do {
      pvVar4 = __ptr->pArray[lVar16];
      uVar1 = *(uint *)((long)pvVar4 + 0x10);
      if ((int)uVar1 < 0) goto LAB_00533086;
      piVar11 = (int *)((ulong)uVar1 * 2);
      iVar13 = (p->vTimArrs).nSize;
      if (iVar13 <= (int)piVar11) goto LAB_00533067;
      iVar2 = *(int *)((long)pvVar4 + 0x1c);
      if (6 < (long)iVar2) {
        __assert_fail("Abc_ObjFaninNum(pNode) <= 6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmTim.c"
                      ,0x67,"void Sfm_TimNodeArrival(Sfm_Tim_t *, Abc_Obj_t *)");
      }
      piVar5 = (p->vTimArrs).pArray;
      if (0 < iVar2) {
        lVar14 = *(long *)((long)pvVar4 + 0x20);
        lVar15 = 0;
        do {
          uVar3 = *(uint *)(lVar14 + lVar15 * 4);
          if ((int)uVar3 < 0) goto LAB_00533086;
          if (iVar13 <= (int)(uVar3 * 2)) goto LAB_00533067;
          *(int **)(&stack0xffffffffffffffa8 + lVar15 * 8) = piVar5 + (ulong)uVar3 * 2;
          lVar15 = lVar15 + 1;
        } while (iVar2 != lVar15);
      }
      Sfm_TimGateArrival(*(Sfm_Tim_t **)((long)pvVar4 + 0x38),(Mio_Gate_t *)&stack0xffffffffffffffa8
                         ,(int **)(piVar5 + (ulong)uVar1 * 2),piVar11);
      lVar16 = lVar16 + 1;
    } while (lVar16 < __ptr->nSize);
  }
  pVVar6 = p->pNtk->vCos;
  lVar16 = (long)pVVar6->nSize;
  if (lVar16 < 1) {
    iVar13 = 0;
  }
  else {
    lVar14 = 0;
    iVar13 = 0;
    do {
      plVar7 = (long *)pVVar6->pArray[lVar14];
      uVar1 = *(uint *)(*(long *)(*(long *)(*(long *)(*plVar7 + 0x20) + 8) +
                                 (long)*(int *)plVar7[4] * 8) + 0x10);
      if ((int)uVar1 < 0) goto LAB_00533086;
      if ((p->vTimArrs).nSize <= (int)(uVar1 * 2)) goto LAB_00533067;
      piVar11 = (p->vTimArrs).pArray;
      iVar2 = piVar11[(ulong)uVar1 * 2];
      iVar17 = piVar11[(ulong)uVar1 * 2 + 1];
      if (iVar17 < iVar2) {
        iVar17 = iVar2;
      }
      if (iVar13 <= iVar17) {
        iVar13 = iVar17;
      }
      lVar14 = lVar14 + 1;
    } while (lVar16 != lVar14);
  }
  iVar2 = p->pNtk->vObjs->nSize;
  uVar10 = (long)iVar2 * 2;
  iVar17 = (int)uVar10;
  if ((p->vTimReqs).nCap < iVar17) {
    piVar11 = (p->vTimReqs).pArray;
    __size = (long)iVar2 << 3;
    if (piVar11 == (int *)0x0) {
      piVar11 = (int *)malloc(__size);
    }
    else {
      piVar11 = (int *)realloc(piVar11,__size);
    }
    (p->vTimReqs).pArray = piVar11;
    if (piVar11 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vTimReqs).nCap = iVar17;
  }
  if (0 < iVar2) {
    piVar11 = (p->vTimReqs).pArray;
    uVar12 = 0;
    do {
      piVar11[uVar12] = 1000000000;
      uVar12 = uVar12 + 1;
    } while ((uVar10 & 0xffffffff) != uVar12);
  }
  (p->vTimReqs).nSize = iVar17;
  pVVar6 = p->pNtk->vCos;
  if (0 < pVVar6->nSize) {
    ppvVar8 = pVVar6->pArray;
    lVar16 = 0;
    do {
      uVar1 = *(uint *)(*(long *)(*(long *)(*(long *)(*ppvVar8[lVar16] + 0x20) + 8) +
                                 (long)**(int **)((long)ppvVar8[lVar16] + 0x20) * 8) + 0x10);
      if ((int)uVar1 < 0) {
LAB_00533086:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      if ((p->vTimReqs).nSize <= (int)(uVar1 * 2)) {
LAB_00533067:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar11 = (p->vTimReqs).pArray;
      piVar11[(ulong)uVar1 * 2 + 1] = iVar13;
      piVar11[(ulong)uVar1 * 2] = iVar13;
      lVar16 = lVar16 + 1;
    } while (lVar16 < pVVar6->nSize);
  }
  lVar16 = (long)__ptr->nSize;
  if (0 < (long)__ptr->nSize) {
    do {
      if (__ptr->nSize < lVar16) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Sfm_TimNodeRequired(p,(Abc_Obj_t *)__ptr->pArray[lVar16 + -1]);
      bVar9 = 1 < lVar16;
      lVar16 = lVar16 + -1;
    } while (bVar9);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Ptr_t *)0x0) {
    free(__ptr);
  }
  return iVar13;
}

Assistant:

int Sfm_TimTrace( Sfm_Tim_t * p )
{
    Abc_Obj_t * pObj; int i, Delay = 0;
    Vec_Ptr_t * vNodes = Abc_NtkDfs( p->pNtk, 1 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Sfm_TimNodeArrival( p, pObj );
    Abc_NtkForEachCo( p->pNtk, pObj, i )
        Delay = Abc_MaxInt( Delay, Sfm_TimArrMax(p, Abc_ObjFanin0(pObj)) );
    Vec_IntFill( &p->vTimReqs, 2*Abc_NtkObjNumMax(p->pNtk), ABC_INFINITY );
    Abc_NtkForEachCo( p->pNtk, pObj, i )
        Sfm_TimSetReq( p, Abc_ObjFanin0(pObj), Delay );
    Vec_PtrForEachEntryReverse( Abc_Obj_t *, vNodes, pObj, i )
        Sfm_TimNodeRequired( p, pObj );
    Vec_PtrFree( vNodes );
    return Delay;
}